

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void calcNodesMatricesRecursive(cgltf_node *node,mat4 *parentMat)

{
  long lVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  cgltf_node **ppcVar5;
  vec<3,_float,_(glm::qualifier)0> *in_RCX;
  qua<float,_(glm::qualifier)0> *extraout_RDX;
  qua<float,_(glm::qualifier)0> *extraout_RDX_00;
  qua<float,_(glm::qualifier)0> *extraout_RDX_01;
  qua<float,_(glm::qualifier)0> *extraout_RDX_02;
  qua<float,_(glm::qualifier)0> *x;
  qua<float,_(glm::qualifier)0> *x_00;
  NodeData *local_360;
  cgltf_node *child;
  cgltf_node **__end1;
  cgltf_node **__begin1;
  CSpan<cgltf_node_*> *__range1;
  CSpan<cgltf_node_*> children;
  float local_31c;
  mat<4,_4,_float,_(glm::qualifier)0> local_318;
  mat<4,_4,_float,_(glm::qualifier)0> local_2d8;
  float local_298;
  mat<4,_4,_float,_(glm::qualifier)0> local_294;
  mat<4,_4,_float,_(glm::qualifier)0> local_254;
  qua<float,_(glm::qualifier)0> local_214;
  mat<4,_4,_float,_(glm::qualifier)0> local_204;
  mat<4,_4,_float,_(glm::qualifier)0> local_1c4;
  undefined1 local_184 [16];
  mat<4,_4,_float,_(glm::qualifier)0> local_174;
  mat<4,_4,_float,_(glm::qualifier)0> local_134;
  float local_f4;
  mat<4,_4,_float,_(glm::qualifier)0> local_f0;
  mat<4,_4,_float,_(glm::qualifier)0> local_b0;
  mat<4,_4,_float,_(glm::qualifier)0> local_70;
  mat<4,4,float,(glm::qualifier)0> *local_30;
  mat4 *mtx;
  NodeData *animData;
  mat4 *pmStack_18;
  i32 nodeInd;
  mat4 *parentMat_local;
  cgltf_node *node_local;
  
  pmStack_18 = parentMat;
  parentMat_local = (mat4 *)node;
  sVar4 = getNodeInd(node);
  animData._4_4_ = (int)sVar4;
  if (anims::playingInd == 0) {
    local_360 = (NodeData *)0x0;
  }
  else {
    local_360 = tl::Vector<anims::NodeData>::operator[]
                          ((Vector<anims::NodeData> *)anims::nodesData,(long)animData._4_4_);
  }
  mtx = (mat4 *)local_360;
  local_30 = (mat<4,4,float,(glm::qualifier)0> *)
             tl::Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::operator[]
                       ((Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)anims::nodesMatrices,
                        (long)animData._4_4_);
  memcpy(local_30,pmStack_18,0x40);
  x = extraout_RDX;
  if (parentMat_local[1].value[1].field_3 !=
      (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0) {
    glm::make_mat4<float>(&local_70,&parentMat_local[2].value[0].field_2.z);
    glm::mat<4,4,float,(glm::qualifier)0>::operator*=(local_30,&local_70);
    x = extraout_RDX_00;
  }
  if ((mtx == (mat4 *)0x0) ||
     (lVar1._0_4_ = mtx->value[0].field_0, lVar1._4_4_ = mtx->value[0].field_1, lVar1 == 0)) {
    if (parentMat_local[1].value[1].field_0 !=
        (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0) {
      local_184._12_4_ = 1.0;
      glm::mat<4,_4,_float,_(glm::qualifier)0>::mat(&local_174,(float *)(local_184 + 0xc));
      glm::vec<3,_float,_(glm::qualifier)0>::vec
                ((vec<3,_float,_(glm::qualifier)0> *)local_184,parentMat_local[1].value[2].field_0.x
                 ,parentMat_local[1].value[2].field_1.y,parentMat_local[1].value[2].field_2.z);
      glm::translate<float,(glm::qualifier)0>
                (&local_134,(glm *)&local_174,(mat<4,_4,_float,_(glm::qualifier)0> *)local_184,
                 in_RCX);
      glm::mat<4,4,float,(glm::qualifier)0>::operator*=(local_30,&local_134);
      x = extraout_RDX_02;
    }
  }
  else {
    local_f4 = 1.0;
    glm::mat<4,_4,_float,_(glm::qualifier)0>::mat(&local_f0,&local_f4);
    glm::translate<float,(glm::qualifier)0>
              (&local_b0,(glm *)&local_f0,*(mat<4,_4,_float,_(glm::qualifier)0> **)mtx->value,in_RCX
              );
    glm::mat<4,4,float,(glm::qualifier)0>::operator*=(local_30,&local_b0);
    x = extraout_RDX_01;
  }
  if ((mtx == (mat4 *)0x0) ||
     (lVar2._0_4_ = mtx->value[0].field_2, lVar2._4_4_ = mtx->value[0].field_3, lVar2 == 0)) {
    if (parentMat_local[1].value[1].field_1 !=
        (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0) {
      glm::qua<float,_(glm::qualifier)0>::qua
                (&local_214,parentMat_local[1].value[3].field_2.z,
                 parentMat_local[1].value[2].field_3.w,parentMat_local[1].value[3].field_0.x,
                 parentMat_local[1].value[3].field_1.y);
      glm::toMat4<float,(glm::qualifier)0>(&local_204,(glm *)&local_214,x_00);
      glm::mat<4,4,float,(glm::qualifier)0>::operator*=(local_30,&local_204);
    }
  }
  else {
    glm::toMat4<float,(glm::qualifier)0>(&local_1c4,*(glm **)&mtx->value[0].field_2,x);
    glm::mat<4,4,float,(glm::qualifier)0>::operator*=(local_30,&local_1c4);
  }
  if ((mtx == (mat4 *)0x0) ||
     (lVar3._0_4_ = mtx->value[1].field_0, lVar3._4_4_ = mtx->value[1].field_1, lVar3 == 0)) {
    if (parentMat_local[1].value[1].field_2 !=
        (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0) {
      local_31c = 1.0;
      glm::mat<4,_4,_float,_(glm::qualifier)0>::mat(&local_318,&local_31c);
      glm::vec<3,_float,_(glm::qualifier)0>::vec
                ((vec<3,_float,_(glm::qualifier)0> *)&children._size,
                 parentMat_local[1].value[3].field_3.w,parentMat_local[2].value[0].field_0.x,
                 parentMat_local[2].value[0].field_1.y);
      glm::scale<float,(glm::qualifier)0>
                (&local_2d8,(glm *)&local_318,(mat<4,_4,_float,_(glm::qualifier)0> *)&children._size
                 ,in_RCX);
      glm::mat<4,4,float,(glm::qualifier)0>::operator*=(local_30,&local_2d8);
    }
  }
  else {
    local_298 = 1.0;
    glm::mat<4,_4,_float,_(glm::qualifier)0>::mat(&local_294,&local_298);
    glm::scale<float,(glm::qualifier)0>
              (&local_254,(glm *)&local_294,
               *(mat<4,_4,_float,_(glm::qualifier)0> **)(mtx->value + 1),in_RCX);
    glm::mat<4,4,float,(glm::qualifier)0>::operator*=(local_30,&local_254);
  }
  sVar4._0_4_ = parentMat_local->value[1].field_2;
  sVar4._4_4_ = parentMat_local->value[1].field_3;
  tl::Span<cgltf_node_*const>::Span
            ((Span<cgltf_node_*const> *)&__range1,*(cgltf_node ***)(parentMat_local->value + 1),
             sVar4);
  __end1 = tl::Span<cgltf_node_*const>::begin((Span<cgltf_node_*const> *)&__range1);
  ppcVar5 = tl::Span<cgltf_node_*const>::end((Span<cgltf_node_*const> *)&__range1);
  while( true ) {
    if (__end1 == ppcVar5) {
      return;
    }
    if (*__end1 == (cgltf_node *)0x0) break;
    calcNodesMatricesRecursive(*__end1,(mat4 *)local_30);
    __end1 = __end1 + 1;
  }
  __assert_fail("child",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                ,0x251,"void calcNodesMatricesRecursive(const cgltf_node &, const glm::mat4 &)");
}

Assistant:

static void calcNodesMatricesRecursive(const cgltf_node& node, const glm::mat4& parentMat = glm::mat4(1.0))
{
    const i32 nodeInd = getNodeInd(&node);
    const auto animData = anims::playingInd ? &anims::nodesData[nodeInd] : nullptr;
    glm::mat4& mtx = anims::nodesMatrices[nodeInd];
    mtx = parentMat;
    if(node.has_matrix)
        mtx *= glm::make_mat4(node.matrix);

    if(animData && animData->position)
        mtx *= glm::translate(glm::mat4(1), *animData->position);
    else if(node.has_translation)
        mtx *= glm::translate(glm::mat4(1), {node.translation[0], node.translation[1], node.translation[2]});

    if(animData && animData->rotation)
        mtx *= glm::toMat4(*animData->rotation);
    else if(node.has_rotation)
        mtx *= glm::toMat4(glm::quat(node.rotation[3], node.rotation[0], node.rotation[1], node.rotation[2]));

    if(animData && animData->scale)
        mtx *= glm::scale(glm::mat4(1), *animData->scale);
    else if(node.has_scale)
        mtx *= glm::scale(glm::mat4(1), vec3(node.scale[0], node.scale[1], node.scale[2]));

    CSpan<cgltf_node*> children(node.children, node.children_count);
    for(cgltf_node* child : children) {
        assert(child);
        calcNodesMatricesRecursive(*child, mtx);
    }
}